

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O1

StringRef __thiscall
llvm::yaml::ScalarNode::getValue(ScalarNode *this,SmallVectorImpl<char> *Storage)

{
  StringRef *this_00;
  size_t sVar1;
  StringRef UnquotedValue_00;
  size_type sVar2;
  void *pvVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  size_t __n;
  char *pcVar7;
  char *From;
  StringRef Chars;
  StringRef SVar8;
  undefined1 local_48 [8];
  StringRef UnquotedValue;
  
  sVar1 = (this->Value).Length;
  UnquotedValue.Length = (size_t)Storage;
  if (sVar1 != 0) {
    this_00 = &this->Value;
    pcVar7 = this_00->Data;
    if (*pcVar7 == '\'') {
      pcVar7 = pcVar7 + 1;
      __n = sVar1 - 1;
      if (sVar1 - 2 <= sVar1 - 1) {
        __n = sVar1 - 2;
      }
      SVar8.Length = __n;
      SVar8.Data = pcVar7;
      if ((__n == 0) || (pvVar3 = memchr(pcVar7,0x27,__n), pvVar3 == (void *)0x0)) {
        lVar5 = -1;
      }
      else {
        lVar5 = (long)pvVar3 - (long)pcVar7;
      }
      if (lVar5 != -1) {
        *(undefined4 *)(UnquotedValue.Length + 8) = 0;
        if (*(uint *)(UnquotedValue.Length + 0xc) < __n) {
          SmallVectorBase::grow_pod
                    ((SmallVectorBase *)UnquotedValue.Length,(void *)(UnquotedValue.Length + 0x10),
                     __n,1);
        }
        do {
          From = pcVar7;
          uVar4 = __n;
          sVar1 = UnquotedValue.Length;
          SmallVectorImpl<char>::insert<char_const*,void>
                    ((SmallVectorImpl<char> *)UnquotedValue.Length,
                     (iterator)
                     ((ulong)*(uint *)(UnquotedValue.Length + 8) + *(long *)UnquotedValue.Length),
                     From,From + lVar5);
          local_48[0] = '\'';
          SmallVectorTemplateBase<char,_true>::push_back
                    ((SmallVectorTemplateBase<char,_true> *)sVar1,local_48);
          uVar6 = lVar5 + 2U;
          if (uVar4 < lVar5 + 2U) {
            uVar6 = uVar4;
          }
          pcVar7 = From + uVar6;
          __n = uVar4 - uVar6;
          if ((__n == 0) || (pvVar3 = memchr(pcVar7,0x27,__n), pvVar3 == (void *)0x0)) {
            lVar5 = -1;
          }
          else {
            lVar5 = (long)pvVar3 - (long)pcVar7;
          }
          sVar1 = UnquotedValue.Length;
        } while (lVar5 != -1);
        SmallVectorImpl<char>::insert<char_const*,void>
                  ((SmallVectorImpl<char> *)UnquotedValue.Length,
                   (iterator)
                   ((ulong)*(uint *)(UnquotedValue.Length + 8) + *(long *)UnquotedValue.Length),
                   pcVar7,From + uVar4);
        SVar8.Length._4_4_ = 0;
        SVar8._0_12_ = *(undefined1 (*) [12])sVar1;
      }
    }
    else if (*pcVar7 == '\"') {
      UnquotedValue.Data = (char *)(sVar1 - 1);
      if ((char *)(sVar1 - 2) <= (char *)(sVar1 - 1)) {
        UnquotedValue.Data = (char *)(sVar1 - 2);
      }
      local_48[0] = (char)(pcVar7 + 1);
      local_48._1_7_ = (undefined7)((ulong)(pcVar7 + 1) >> 8);
      Chars.Length = 3;
      Chars.Data = "\\\r\n";
      sVar2 = StringRef::find_first_of((StringRef *)local_48,Chars,0);
      SVar8.Data._1_7_ = local_48._1_7_;
      SVar8.Data._0_1_ = local_48[0];
      SVar8.Length = (size_t)UnquotedValue.Data;
      UnquotedValue_00.Data._1_7_ = local_48._1_7_;
      UnquotedValue_00.Data._0_1_ = local_48[0];
      UnquotedValue_00.Length = (size_t)UnquotedValue.Data;
      if (sVar2 != 0xffffffffffffffff) {
        SVar8 = unescapeDoubleQuoted
                          (this,UnquotedValue_00,sVar2,(SmallVectorImpl<char> *)UnquotedValue.Length
                          );
      }
    }
    else {
      sVar2 = StringRef::find_last_not_of(this_00,' ',0xffffffffffffffff);
      uVar6 = (this->Value).Length;
      uVar4 = sVar2 + 1;
      if (uVar6 <= sVar2 + 1) {
        uVar4 = uVar6;
      }
      SVar8 = StringRef::drop_back(this_00,sVar1 - uVar4);
    }
    return SVar8;
  }
  __assert_fail("Index < Length && \"Invalid index!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/StringRef.h"
                ,0xf9,"char llvm::StringRef::operator[](size_t) const");
}

Assistant:

StringRef ScalarNode::getValue(SmallVectorImpl<char> &Storage) const {
  // TODO: Handle newlines properly. We need to remove leading whitespace.
  if (Value[0] == '"') { // Double quoted.
    // Pull off the leading and trailing "s.
    StringRef UnquotedValue = Value.substr(1, Value.size() - 2);
    // Search for characters that would require unescaping the value.
    StringRef::size_type i = UnquotedValue.find_first_of("\\\r\n");
    if (i != StringRef::npos)
      return unescapeDoubleQuoted(UnquotedValue, i, Storage);
    return UnquotedValue;
  } else if (Value[0] == '\'') { // Single quoted.
    // Pull off the leading and trailing 's.
    StringRef UnquotedValue = Value.substr(1, Value.size() - 2);
    StringRef::size_type i = UnquotedValue.find('\'');
    if (i != StringRef::npos) {
      // We're going to need Storage.
      Storage.clear();
      Storage.reserve(UnquotedValue.size());
      for (; i != StringRef::npos; i = UnquotedValue.find('\'')) {
        StringRef Valid(UnquotedValue.begin(), i);
        Storage.insert(Storage.end(), Valid.begin(), Valid.end());
        Storage.push_back('\'');
        UnquotedValue = UnquotedValue.substr(i + 2);
      }
      Storage.insert(Storage.end(), UnquotedValue.begin(), UnquotedValue.end());
      return StringRef(Storage.begin(), Storage.size());
    }
    return UnquotedValue;
  }
  // Plain or block.
  return Value.rtrim(' ');
}